

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> __thiscall
wabt::interp::TagType::Clone(TagType *this)

{
  _func_int **in_RAX;
  _func_int **local_18;
  
  local_18 = in_RAX;
  std::make_unique<wabt::interp::TagType,wabt::interp::TagType_const&>
            ((TagType *)&stack0xffffffffffffffe8);
  (this->super_ExternType)._vptr_ExternType = local_18;
  return (__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
          )(__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<ExternType> TagType::Clone() const {
  return std::make_unique<TagType>(*this);
}